

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O3

void __thiscall
front::irGenerator::irGenerator::ir_declare_value
          (irGenerator *this,string *name,SymbolKind kind,int id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *inits,localArrayInitType initType,
          int len)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
  *this_00;
  pointer pbVar1;
  size_t __n;
  pointer pcVar2;
  string name_00;
  string name_01;
  string name_02;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  PtrTy *pPVar6;
  long *plVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  uint extraout_var;
  uint extraout_var_00;
  uint extraout_var_01;
  uint32_t id_00;
  uint32_t id_01;
  uint32_t id_02;
  undefined1 auVar10 [8];
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pvVar11;
  long lVar12;
  undefined4 in_register_0000008c;
  undefined1 this_01 [8];
  initializer_list<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  string varName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> varNameRef;
  undefined8 in_stack_fffffffffffffb68;
  undefined8 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  undefined1 local_478 [32];
  byte local_458;
  undefined4 local_454;
  undefined4 uStack_450;
  int iStack_44c;
  value_type local_448;
  undefined1 local_428 [8];
  undefined1 auStack_420 [8];
  PtrTy local_418;
  _Variadic_union<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_400;
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3d8;
  undefined4 local_3ac;
  _Variadic_union<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a8;
  byte local_388;
  Variable local_378;
  _Variadic_union<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_358;
  byte local_338;
  undefined8 local_328;
  string local_320;
  string local_300;
  string local_2e0;
  SharedTyPtr local_2c0;
  SharedTyPtr local_2b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2a0;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  SharedTyPtr local_208;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  long *local_190 [2];
  long local_180 [2];
  long *local_170 [2];
  long local_160 [2];
  long *local_150 [2];
  long local_140 [2];
  undefined1 local_130 [32];
  byte local_110;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  byte local_e8;
  undefined1 local_e0 [32];
  byte local_c0;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  byte local_98;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  local_328 = CONCAT44(in_register_0000008c,initType);
  pbVar1 = (this->_funcStack).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __n = pbVar1[-1]._M_string_length;
  if ((__n == (this->_GlobalInitFuncName)._M_string_length) &&
     ((__n == 0 ||
      (iVar5 = bcmp(pbVar1[-1]._M_dataplus._M_p,(this->_GlobalInitFuncName)._M_dataplus._M_p,__n),
      iVar5 == 0)))) {
    uVar3 = (ulong)auStack_420 >> 0x20;
    auStack_420 = (undefined1  [8])(uVar3 << 0x20);
    local_400._M_first._M_storage._0_1_ = 0;
    local_428 = (undefined1  [8])&PTR_display_001ed760;
    uVar4 = (uint)local_400._12_4_ >> 8;
    local_400._12_4_ = uVar4 << 8;
    if (len == 0) {
      auStack_420 = (undefined1  [8])(uVar3 << 0x20);
      local_400._4_8_ = (ulong)(uint)local_400._8_4_ << 0x20;
      local_400._12_4_ = uVar4 << 8;
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_2a0,inits);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_478,&local_2a0);
      local_458 = 1;
      in_stack_fffffffffffffb80 = 0x1ed760;
      in_stack_fffffffffffffb84 = 0;
      local_454 = 0;
      uStack_450 = 0;
      iStack_44c = 0;
      local_3a8._0_8_ =
           (variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)auStack_420;
      std::operator=(&local_3a8,
                     (variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_478,&local_358);
      local_400._4_8_ = CONCAT44(uStack_450,local_454);
      local_400._12_4_ = iStack_44c;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_458]._M_data)
                ((anon_class_1_0_00000001 *)&local_3a8._M_first,
                 (variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_478);
      local_458 = 0xff;
      if (local_2a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_2a0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2a0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    pcVar2 = (name->_M_dataplus)._M_p;
    local_150[0] = local_140;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_150,pcVar2,pcVar2 + name->_M_string_length);
    name_01._M_string_length = in_stack_fffffffffffffb70;
    name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb68;
    name_01.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffb78;
    name_01.field_2._M_allocated_capacity._4_4_ = id;
    name_01.field_2._8_4_ = in_stack_fffffffffffffb80;
    name_01.field_2._12_4_ = in_stack_fffffffffffffb84;
    getVarName((string *)&stack0xfffffffffffffb80,this,name_01,id_01);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
             ::operator[](&(this->_package).global_values,(key_type *)&stack0xfffffffffffffb80);
    local_3a8._0_8_ = &pmVar8->field_0x8;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[(byte)local_400._M_first._M_storage._0_1_]._M_data)
              ((anon_class_8_1_8991fb9c_conflict2 *)&local_3a8._M_first,
               (variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)auStack_420);
    *(undefined4 *)
     &(pmVar8->len).super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = local_400._12_4_;
    pmVar8->ty = local_400._4_4_;
    (pmVar8->len).super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
    ._M_payload = (_Storage<int,_true>)local_400._8_4_;
    if ((undefined1 *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80) != local_478 + 8
       ) {
      operator_delete((undefined1 *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (ulong)(local_478._8_8_ + 1));
    }
    if (local_150[0] != local_140) {
      operator_delete(local_150[0],local_140[0] + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[(byte)local_400._M_first._M_storage._0_1_]._M_data)
              ((anon_class_1_0_00000001 *)&stack0xfffffffffffffb80,
               (variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)auStack_420);
    return;
  }
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  local_448._M_string_length = 0;
  local_448.field_2._M_local_buf[0] = '\0';
  if (kind == INT) {
    local_428 = (undefined1  [8])operator_new(8);
    (((PtrTy *)local_428)->super_Ty).super_Displayable._vptr_Displayable =
         (_func_int **)&PTR_display_001ecd58;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_420,(IntTy *)local_428);
    auVar10 = local_428;
    this_01 = auStack_420;
LAB_001843e2:
    if (this_01 != (undefined1  [8])0x0) {
      local_378.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _7_1_ = (undefined1)((ulong)this_01 >> 0x38);
      local_378.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_7_ = SUB87(this_01,0);
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01)->_M_use_count + 1;
        UNLOCK();
        if (__libc_single_threaded != '\0') {
          iVar5 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01)->_M_use_count;
          goto LAB_0018449c;
        }
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        iVar5 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01)->_M_use_count + 1;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01)->_M_use_count = iVar5;
LAB_0018449c:
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01)->_M_use_count = iVar5 + 1;
      }
      local_378.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ecf68;
      local_378.is_memory_var = false;
      local_378.is_temp_var = false;
      local_378.is_phi_var = false;
      local_378.priority = 0;
      local_378.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)auVar10;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
      local_3ac = 0;
      goto LAB_001844d2;
    }
  }
  else {
    if (kind == Array) {
      if ((int)local_328 - 1U < 2) {
        pcVar2 = (name->_M_dataplus)._M_p;
        local_170[0] = local_160;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_170,pcVar2,pcVar2 + name->_M_string_length);
        name_00._M_string_length = in_stack_fffffffffffffb70;
        name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb68;
        name_00.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffb78;
        name_00.field_2._M_allocated_capacity._4_4_ = id;
        name_00.field_2._8_4_ = in_stack_fffffffffffffb80;
        name_00.field_2._12_4_ = in_stack_fffffffffffffb84;
        getVarName((string *)&stack0xfffffffffffffb80,this,name_00,id_00);
        plVar7 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffb80);
        pPVar6 = (PtrTy *)(plVar7 + 2);
        if ((PtrTy *)*plVar7 == pPVar6) {
          local_418.super_Ty.super_Displayable._vptr_Displayable =
               (Displayable)(pPVar6->super_Ty).super_Displayable._vptr_Displayable;
          local_418.item.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)plVar7[3];
          local_428 = (undefined1  [8])&local_418;
        }
        else {
          local_418.super_Ty.super_Displayable._vptr_Displayable =
               (Displayable)(pPVar6->super_Ty).super_Displayable._vptr_Displayable;
          local_428 = (undefined1  [8])*plVar7;
        }
        auStack_420 = (undefined1  [8])plVar7[1];
        *plVar7 = (long)pPVar6;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((undefined1 *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80) !=
            local_478 + 8) {
          operator_delete((undefined1 *)
                          CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                          (ulong)(local_478._8_8_ + 1));
        }
        if (local_170[0] != local_160) {
          operator_delete(local_170[0],local_160[0] + 1);
        }
        mir::types::new_int_ty();
        local_208.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_358._0_8_;
        local_208.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._8_8_;
        local_358._0_8_ = 0;
        local_358._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        mir::types::new_array_ty((types *)&local_3a8._M_first,&local_208,len);
        local_478._8_8_ = local_3a8._8_8_;
        local_478._0_8_ = local_3a8._0_8_;
        local_3a8._0_8_ =
             (variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0;
        local_3a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        in_stack_fffffffffffffb80 = 0x1ecf68;
        in_stack_fffffffffffffb84 = 0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_478._8_8_ ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_478._16_2_ = 1;
          local_478[0x12] = '\0';
          local_478._20_4_ = 0;
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_478._8_8_ + 8) = *(_Atomic_word *)(local_478._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_478._8_8_ + 8) = *(_Atomic_word *)(local_478._8_8_ + 8) + 1;
          }
          local_478._16_2_ = 1;
          local_478[0x12] = '\0';
          local_478._20_4_ = 0;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_478._8_8_);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8._8_8_);
          }
        }
        if (local_208.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_208.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._8_8_);
        }
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_228,local_428,(pointer)((long)auStack_420 + (long)local_428));
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
                 ::operator[](&this->_funcNameToFuncData,
                              (this->_funcStack).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + -1);
        insertLocalValue(this,&local_228,pmVar9->_nowLocalValueId,
                         (Variable *)&stack0xfffffffffffffb80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
                 ::operator[](&this->_funcNameToFuncData,
                              (this->_funcStack).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + -1);
        pmVar9->_nowLocalValueId = pmVar9->_nowLocalValueId + 1;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_478._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_478._8_8_);
        }
        if (local_428 != (undefined1  [8])&local_418) {
          operator_delete((void *)local_428,
                          (long)local_418.super_Ty.super_Displayable._vptr_Displayable + 1);
        }
      }
      pPVar6 = (PtrTy *)operator_new(0x18);
      local_2b0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)operator_new(8);
      ((Displayable *)
      &((local_2b0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       super_Displayable)._vptr_Displayable)->_vptr_Displayable =
           (_func_int **)&PTR_display_001ecd58;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                (&local_2b0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 (IntTy *)local_2b0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
      mir::types::PtrTy::PtrTy(pPVar6,&local_2b0);
      local_428 = (undefined1  [8])pPVar6;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::PtrTy*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_420,pPVar6);
      auVar10 = local_428;
      local_2c0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_2b0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      this_01 = auStack_420;
LAB_001843d8:
      auStack_420 = (undefined1  [8])0x0;
      local_428 = (undefined1  [8])0x0;
      if (local_2c0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2c0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      goto LAB_001843e2;
    }
    if (kind == Ptr) {
      pPVar6 = (PtrTy *)operator_new(0x18);
      local_2c0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)operator_new(8);
      ((Displayable *)
      &((local_2c0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       super_Displayable)._vptr_Displayable)->_vptr_Displayable =
           (_func_int **)&PTR_display_001ecd58;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                (&local_2c0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 (IntTy *)local_2c0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
      mir::types::PtrTy::PtrTy(pPVar6,&local_2c0);
      local_428 = (undefined1  [8])pPVar6;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::PtrTy*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_420,pPVar6);
      auVar10 = local_428;
      this_01 = auStack_420;
      goto LAB_001843d8;
    }
    auVar10 = (undefined1  [8])0x0;
  }
  local_378.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ecf68;
  this_01 = (undefined1  [8])0x0;
  local_378.priority = 0;
  local_378.is_memory_var = false;
  local_378.is_temp_var = false;
  local_378.is_phi_var = false;
  local_378.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_7_ = 0;
  local_378.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _7_1_ = 0;
  local_3ac = 0x1ecf01;
  local_378.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auVar10;
LAB_001844d2:
  pcVar2 = (name->_M_dataplus)._M_p;
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_190,pcVar2,pcVar2 + name->_M_string_length);
  name_02._M_string_length = (size_type)this_01;
  name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb68;
  name_02.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffb78;
  name_02.field_2._M_allocated_capacity._4_4_ = id;
  name_02.field_2._8_4_ = in_stack_fffffffffffffb80;
  name_02.field_2._12_4_ = in_stack_fffffffffffffb84;
  getVarName((string *)local_428,this,name_02,id_02);
  std::__cxx11::string::operator=((string *)&local_448,(string *)local_428);
  if (local_428 != (undefined1  [8])&local_418) {
    operator_delete((void *)local_428,
                    (long)local_418.super_Ty.super_Displayable._vptr_Displayable + 1);
  }
  if (local_190[0] != local_180) {
    operator_delete(local_190[0],local_180[0] + 1);
  }
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,local_448._M_dataplus._M_p,
             local_448._M_dataplus._M_p + local_448._M_string_length);
  this_00 = &this->_funcNameToFuncData;
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
           ::operator[](this_00,(this->_funcStack).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1);
  insertLocalValue(this,&local_248,pmVar9->_nowLocalValueId,&local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
           ::operator[](this_00,(this->_funcStack).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1);
  pmVar9->_nowLocalValueId = pmVar9->_nowLocalValueId + 1;
  if (kind == Array) {
    switch((int)local_328) {
    case 1:
      local_b8._0_8_ = (long)&local_b8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,local_448._M_dataplus._M_p,
                 local_448._M_dataplus._M_p + local_448._M_string_length);
      local_98 = 1;
      local_428 = (undefined1  [8])&local_418;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_428,local_448._M_dataplus._M_p,
                 local_448._M_dataplus._M_p + local_448._M_string_length);
      std::__cxx11::string::append(local_428);
      local_e0._0_8_ = local_e0 + 0x10;
      if (local_428 == (undefined1  [8])&local_418) {
        local_e0._24_8_ =
             local_418.item.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      else {
        local_e0._0_8_ = local_428;
      }
      local_e0._16_8_ = local_418.super_Ty.super_Displayable._vptr_Displayable;
      local_e0._8_8_ = auStack_420;
      auStack_420 = (undefined1  [8])0x0;
      local_418.super_Ty.super_Displayable._vptr_Displayable =
           (Displayable)
           ((ulong)local_418.super_Ty.super_Displayable._vptr_Displayable & 0xffffffffffffff00);
      local_c0 = 1;
      local_428 = (undefined1  [8])&local_418;
      ir_ref(this,(LeftVal *)&local_b8._M_first,(LeftVal *)local_e0,true);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_c0]._M_data)
                ((anon_class_1_0_00000001 *)&stack0xfffffffffffffb80,
                 (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_e0);
      local_c0 = 0xff;
      if (local_428 != (undefined1  [8])&local_418) {
        operator_delete((void *)local_428,
                        (long)local_418.super_Ty.super_Displayable._vptr_Displayable + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_98]._M_data)
                ((anon_class_1_0_00000001 *)local_428,
                 (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b8._M_first);
      local_98 = 0xff;
      break;
    case 2:
      local_108._0_8_ = (long)&local_108 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,local_448._M_dataplus._M_p,
                 local_448._M_dataplus._M_p + local_448._M_string_length);
      local_e8 = 1;
      local_428 = (undefined1  [8])&local_418;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_428,local_448._M_dataplus._M_p,
                 local_448._M_dataplus._M_p + local_448._M_string_length);
      std::__cxx11::string::append(local_428);
      local_130._0_8_ = local_130 + 0x10;
      if (local_428 == (undefined1  [8])&local_418) {
        local_130._24_8_ =
             local_418.item.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      else {
        local_130._0_8_ = local_428;
      }
      local_130._16_8_ = local_418.super_Ty.super_Displayable._vptr_Displayable;
      local_130._8_8_ = auStack_420;
      auStack_420 = (undefined1  [8])0x0;
      local_418.super_Ty.super_Displayable._vptr_Displayable =
           (Displayable)
           ((ulong)local_418.super_Ty.super_Displayable._vptr_Displayable & 0xffffffffffffff00);
      local_110 = 1;
      local_428 = (undefined1  [8])&local_418;
      ir_ref(this,(LeftVal *)&local_108._M_first,(LeftVal *)local_130,true);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_110]._M_data)
                ((anon_class_1_0_00000001 *)&stack0xfffffffffffffb80,
                 (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_130);
      local_110 = 0xff;
      if (local_428 != (undefined1  [8])&local_418) {
        operator_delete((void *)local_428,
                        (long)local_418.super_Ty.super_Displayable._vptr_Displayable + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_e8]._M_data)
                ((anon_class_1_0_00000001 *)local_428,
                 (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_108._M_first);
      local_e8 = 0xff;
      local_478[0x18] = 0;
      local_3a8._0_8_ = local_3a8._0_8_ & 0xffffffff00000000;
      local_388 = 0;
      iVar5 = (*(((PtrTy *)auVar10)->super_Ty).super_Displayable._vptr_Displayable[3])(auVar10);
      if ((extraout_var_01 & 1) == 0) {
        std::__throw_bad_optional_access();
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_388]._M_data)
                ((anon_class_1_0_00000001 *)local_428,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3a8._M_first);
      local_3a8._M_first._M_storage = (_Uninitialized<int,_true>)(iVar5 * len);
      local_388 = 0;
      std::get<0ul,int,int,std::__cxx11::string>
                ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3a8._M_first);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[(byte)local_478[0x18]]._M_data)
                ((anon_class_1_0_00000001 *)local_428,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffb80);
      local_478[0x18] = 0;
      std::get<0ul,int,int,std::__cxx11::string>
                ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffb80);
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      local_2e0._M_string_length = 0;
      local_2e0.field_2._M_local_buf[0] = '\0';
      local_1b0.field_2._M_allocated_capacity._0_4_ = 0x736d656d;
      local_1b0.field_2._M_allocated_capacity._4_2_ = 0x7465;
      local_1b0._M_string_length = 6;
      local_1b0.field_2._M_local_buf[6] = '\0';
      local_428 = (undefined1  [8])&local_418;
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_428,local_448._M_dataplus._M_p,
                 local_448._M_dataplus._M_p + local_448._M_string_length);
      local_418.item.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._0_1_ = 2;
      std::__detail::__variant::
      _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_400._M_first,
                        (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&stack0xfffffffffffffb80);
      std::__detail::__variant::
      _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_3d8,
                        (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_3a8._M_first);
      __l_02._M_len = 3;
      __l_02._M_array = (iterator)local_428;
      std::
      vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_48,__l_02,(allocator_type *)&local_358._M_first);
      ir_function_call(this,&local_2e0,VID,&local_1b0,&local_48,true);
      std::
      vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_48);
      lVar12 = -0x78;
      pvVar11 = &local_3d8;
      do {
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr
          [(pvVar11->
           super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index].
          _M_data)((anon_class_1_0_00000001 *)&local_358._M_first,pvVar11);
        (pvVar11->
        super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
        pvVar11 = pvVar11 + -1;
        lVar12 = lVar12 + 0x28;
      } while (lVar12 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,
                        CONCAT17(local_1b0.field_2._M_local_buf[7],
                                 CONCAT16(local_1b0.field_2._M_local_buf[6],
                                          CONCAT24(local_1b0.field_2._M_allocated_capacity._4_2_,
                                                   local_1b0.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,
                        CONCAT71(local_2e0.field_2._M_allocated_capacity._1_7_,
                                 local_2e0.field_2._M_local_buf[0]) + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_388]._M_data)
                ((anon_class_1_0_00000001 *)local_428,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3a8._M_first);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[(byte)local_478[0x18]]._M_data)
                ((anon_class_1_0_00000001 *)local_428,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffb80);
      break;
    case 3:
      local_428 = (undefined1  [8])((ulong)local_428 & 0xffffffff00000000);
      local_418.item.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._0_1_ = 0;
      iVar5 = (*(((PtrTy *)auVar10)->super_Ty).super_Displayable._vptr_Displayable[3])(auVar10);
      if ((extraout_var & 1) == 0) {
        std::__throw_bad_optional_access();
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr
        [(byte)local_418.item.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_1_]._M_data)
                ((anon_class_1_0_00000001 *)&stack0xfffffffffffffb80,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_428);
      local_428._0_4_ = iVar5 * len;
      local_418.item.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._0_1_ = 0;
      std::get<0ul,int,int,std::__cxx11::string>
                ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_428);
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_288,local_448._M_dataplus._M_p,
                 local_448._M_dataplus._M_p + local_448._M_string_length);
      local_1f0.field_2._M_allocated_capacity._0_4_ = 0x6c6c616d;
      local_1f0.field_2._M_allocated_capacity._4_2_ = 0x636f;
      local_1f0._M_string_length = 6;
      local_1f0.field_2._M_local_buf[6] = '\0';
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__detail::__variant::
      _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&stack0xfffffffffffffb80,
                        (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_428);
      __l._M_len = 1;
      __l._M_array = (iterator)&stack0xfffffffffffffb80;
      std::
      vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_90,__l,(allocator_type *)&local_3a8._M_first);
      ir_function_call(this,&local_288,Ptr,&local_1f0,&local_90,true);
      std::
      vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_90);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[(byte)local_478[0x18]]._M_data)
                ((anon_class_1_0_00000001 *)&local_3a8._M_first,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffb80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        CONCAT17(local_1f0.field_2._M_local_buf[7],
                                 CONCAT16(local_1f0.field_2._M_local_buf[6],
                                          CONCAT24(local_1f0.field_2._M_allocated_capacity._4_2_,
                                                   local_1f0.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
               ::operator[](this_00,(this->_funcStack).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + -1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pmVar9->_freeList,&local_448);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr
        [(byte)local_418.item.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_1_]._M_data)
                ((anon_class_1_0_00000001 *)&stack0xfffffffffffffb80,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_428);
      break;
    case 4:
      local_478[0x18] = 0;
      local_3a8._0_8_ = local_3a8._0_8_ & 0xffffffff00000000;
      local_388 = 0;
      local_358._0_8_ = local_358._0_8_ & 0xffffffff00000000;
      local_338 = 0;
      iVar5 = (*(((PtrTy *)auVar10)->super_Ty).super_Displayable._vptr_Displayable[3])(auVar10);
      if ((extraout_var_00 & 1) == 0) {
        std::__throw_bad_optional_access();
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_388]._M_data)
                ((anon_class_1_0_00000001 *)local_428,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3a8._M_first);
      local_3a8._M_first._M_storage = (_Uninitialized<int,_true>)(iVar5 * len);
      local_388 = 0;
      std::get<0ul,int,int,std::__cxx11::string>
                ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3a8._M_first);
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_268,local_448._M_dataplus._M_p,
                 local_448._M_dataplus._M_p + local_448._M_string_length);
      local_1d0.field_2._M_allocated_capacity._0_4_ = 0x6c6c616d;
      local_1d0.field_2._M_allocated_capacity._4_2_ = 0x636f;
      local_1d0._M_string_length = 6;
      local_1d0.field_2._M_local_buf[6] = '\0';
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__detail::__variant::
      _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_428,
                        (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_3a8._M_first);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)local_428;
      std::
      vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_60,__l_00,(allocator_type *)&stack0xfffffffffffffb6f);
      ir_function_call(this,&local_268,Ptr,&local_1d0,&local_60,true);
      std::
      vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_60);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr
        [(byte)local_418.item.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_1_]._M_data)
                ((anon_class_1_0_00000001 *)&stack0xfffffffffffffb6f,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_428);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,
                        CONCAT17(local_1d0.field_2._M_local_buf[7],
                                 CONCAT16(local_1d0.field_2._M_local_buf[6],
                                          CONCAT24(local_1d0.field_2._M_allocated_capacity._4_2_,
                                                   local_1d0.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_338]._M_data)
                ((anon_class_1_0_00000001 *)local_428,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_358._M_first);
      local_358._0_8_ = local_358._0_8_ & 0xffffffff00000000;
      local_338 = 0;
      std::get<0ul,int,int,std::__cxx11::string>
                ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_358._M_first);
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      local_300._M_string_length = 0;
      local_300.field_2._M_local_buf[0] = '\0';
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      local_320.field_2._M_allocated_capacity._0_4_ = 0x736d656d;
      local_320.field_2._M_allocated_capacity._4_2_ = 0x7465;
      local_320._M_string_length = 6;
      local_320.field_2._M_local_buf[6] = '\0';
      local_428 = (undefined1  [8])&local_418;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_428,local_448._M_dataplus._M_p,
                 local_448._M_dataplus._M_p + local_448._M_string_length);
      local_418.item.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._0_1_ = 2;
      std::__detail::__variant::
      _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_400._M_first,
                        (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_358._M_first);
      std::__detail::__variant::
      _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_3d8,
                        (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_3a8._M_first);
      __l_01._M_len = 3;
      __l_01._M_array = (iterator)local_428;
      std::
      vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_78,__l_01,(allocator_type *)&stack0xfffffffffffffb6f);
      ir_function_call(this,&local_300,VID,&local_320,&local_78,true);
      std::
      vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_78);
      lVar12 = -0x78;
      pvVar11 = &local_3d8;
      do {
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr
          [(pvVar11->
           super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index].
          _M_data)((anon_class_1_0_00000001 *)&stack0xfffffffffffffb6f,pvVar11);
        (pvVar11->
        super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
        pvVar11 = pvVar11 + -1;
        lVar12 = lVar12 + 0x28;
      } while (lVar12 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        CONCAT17(local_320.field_2._M_local_buf[7],
                                 CONCAT16(local_320.field_2._M_local_buf[6],
                                          CONCAT24(local_320.field_2._M_allocated_capacity._4_2_,
                                                   local_320.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,
                        CONCAT71(local_300.field_2._M_allocated_capacity._1_7_,
                                 local_300.field_2._M_local_buf[0]) + 1);
      }
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
               ::operator[](this_00,(this->_funcStack).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + -1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pmVar9->_freeList,&local_448);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_338]._M_data)
                ((anon_class_1_0_00000001 *)local_428,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_358._M_first);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_388]._M_data)
                ((anon_class_1_0_00000001 *)local_428,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3a8._M_first);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[(byte)local_478[0x18]]._M_data)
                ((anon_class_1_0_00000001 *)local_428,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffb80);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT17(local_378.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._7_1_,
               local_378.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_7_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT17(local_378.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._7_1_,
                        local_378.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_7_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,
                    CONCAT71(local_448.field_2._M_allocated_capacity._1_7_,
                             local_448.field_2._M_local_buf[0]) + 1);
  }
  if ((char)local_3ac == '\0') {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  return;
}

Assistant:

void irGenerator::ir_declare_value(string name, symbol::SymbolKind kind, int id,
                                   std::vector<uint32_t> inits,
                                   localArrayInitType initType, int len) {
  if (_funcStack.back() == _GlobalInitFuncName) {
    GlobalValue globalValue;
    if (len == 0) {
      globalValue = GlobalValue(0);
    } else {
      globalValue = GlobalValue(inits);
    }
    _package.global_values[getVarName(name, id)] = globalValue;
  } else {
    SharedTyPtr ty;
    bool is_memory;
    string varName;

    switch (kind) {
      case front::symbol::SymbolKind::INT:
        ty = SharedTyPtr(new IntTy());
        is_memory = false;
        break;
      case front::symbol::SymbolKind::Array:
        if (initType == localArrayInitType::Small ||
            initType == localArrayInitType::SmallInit) {
          auto varNameRef = getVarName(name, id) + "_$array";

          Variable variable(
              mir::types::new_array_ty(mir::types::new_int_ty(), len), true,
              false, false);
          insertLocalValue(
              varNameRef,
              _funcNameToFuncData[_funcStack.back()]._nowLocalValueId,
              variable);
          _funcNameToFuncData[_funcStack.back()]._nowLocalValueId++;
        }
        ty = SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy())));
        is_memory = false;
        break;
      case front::symbol::SymbolKind::Ptr:
        ty = SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy())));
        is_memory = false;
        break;
      default:
        break;
    }
    Variable variable(ty, is_memory, false);
    varName = getVarName(name, id);

    insertLocalValue(varName,
                     _funcNameToFuncData[_funcStack.back()]._nowLocalValueId,
                     variable);
    _funcNameToFuncData[_funcStack.back()]._nowLocalValueId++;

    if (kind == symbol::SymbolKind::Array) {
      switch (initType) {
        case localArrayInitType::Small: {
          ir_ref(varName, varName + "_$array", true);
          break;
        }
        case localArrayInitType::SmallInit: {
          ir_ref(varName, varName + "_$array", true);
          RightVal value;
          RightVal size;
          size.emplace<0>(len * ty->size().value());
          value.emplace<0>(0);
          ir_function_call("", symbol::SymbolKind::VID, "memset",
                           {varName, value, size}, true);
          break;
        }
        case localArrayInitType::BigInit: {
          RightVal nitems;
          RightVal size;
          RightVal value;

          size.emplace<0>(len * ty->size().value());
          ir_function_call(varName, symbol::SymbolKind::Ptr, "malloc", {size},
                           true);
          value.emplace<0>(0);
          ir_function_call("", symbol::SymbolKind::VID, "memset",
                           {varName, value, size}, true);
          _funcNameToFuncData[_funcStack.back()]._freeList.push_back(varName);
          break;
        }
        case localArrayInitType::BigNoInit: {
          RightVal right;
          right.emplace<0>(len * ty->size().value());
          ir_function_call(varName, symbol::SymbolKind::Ptr, "malloc", {right},
                           true);
          _funcNameToFuncData[_funcStack.back()]._freeList.push_back(varName);
          break;
        }
        default:
          break;
      }
    }
  }
}